

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.cpp
# Opt level: O0

string * FormatHDKeypath_abi_cxx11_
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *path,bool apostrophe)

{
  long lVar1;
  bool bVar2;
  reference puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  string *ret;
  const_iterator __end1;
  const_iterator __begin1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  char in_stack_ffffffffffffff77;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  uint *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar4 = in_RDI;
  std::__cxx11::string::string(in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  while (bVar2 = __gnu_cxx::
                 operator==<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_ffffffffffffff68);
    uVar5 = *puVar3;
    tinyformat::format<unsigned_int>
              ((char *)CONCAT44(uVar5,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    std::__cxx11::string::~string(in_stack_ffffffffffffff68);
    if ((int)uVar5 < 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,in_stack_ffffffffffffff77);
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  *)in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pbVar4;
}

Assistant:

std::string FormatHDKeypath(const std::vector<uint32_t>& path, bool apostrophe)
{
    std::string ret;
    for (auto i : path) {
        ret += strprintf("/%i", (i << 1) >> 1);
        if (i >> 31) ret += apostrophe ? '\'' : 'h';
    }
    return ret;
}